

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O3

int opj_getopt_long(int argc,char **argv,char *optstring,opj_option_t *longopts,int totlen)

{
  int *piVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *__s;
  char cVar8;
  int local_60;
  int local_5c;
  
  if (argc <= opj_optind) {
    return -1;
  }
  local_60 = opj_getopt_long::lastofs;
  local_5c = opj_getopt_long::lastidx;
  cVar8 = '\x01';
LAB_0010f74c:
  lVar2 = (long)opj_optind;
  pcVar7 = argv[lVar2];
  if (pcVar7 == (char *)0x0) {
    return -1;
  }
  if (*pcVar7 != '-') {
    return -1;
  }
  if (pcVar7[1] == '\0') {
    if ((argc + -1 <= opj_optind) || (cVar8 = '\x02', *argv[lVar2 + 1] == '-')) {
      opj_optind = opj_optind + 1;
      return 0x3f;
    }
LAB_0010f797:
    opj_optind = opj_optind + 1;
    __s = argv[lVar2 + 1];
    pcVar7 = __s;
  }
  else {
    if (cVar8 != '\x01') goto LAB_0010f797;
    __s = pcVar7 + 1;
    cVar8 = '\x01';
  }
  iVar6 = opj_optind;
  sVar3 = strlen(__s);
  if (sVar3 < 2) {
    if (*optstring == ':') {
      return 0x3a;
    }
    if (local_5c != iVar6) {
      opj_getopt_long::lastofs = 0;
      local_60 = 0;
      opj_getopt_long::lastidx = iVar6;
      local_5c = iVar6;
    }
    lVar2 = (long)local_60;
    iVar5 = (int)pcVar7[lVar2 + 1];
    opj_optopt = iVar5;
    pcVar4 = strchr(optstring,iVar5);
    if (pcVar4 == (char *)0x0) {
      opj_getopt_long_cold_1();
      return 0x3f;
    }
    if (*pcVar4 != '\0') {
      if (pcVar4[1] != ':') {
        opj_getopt_long::lastofs = local_60 + 1;
        return iVar5;
      }
      if ((pcVar4[2] == ':') || (pcVar7[lVar2 + 2] != '\0')) {
        opj_optarg = (char *)0x0;
        if (pcVar7[lVar2 + 2] != '\0') {
          opj_optarg = pcVar7 + lVar2 + 2;
        }
      }
      else {
        opj_optarg = argv[(long)iVar6 + 1];
        if (((opj_optarg == (char *)0x0) || (*opj_optarg == '-')) && (opj_opterr != 0)) {
          pcVar7 = "%s: option requires an argument\n";
          goto LAB_0010fa0f;
        }
        iVar6 = iVar6 + 1;
      }
      opj_optind = iVar6 + 1;
      return iVar5;
    }
    opj_optind = iVar6 + 1;
    if (argc <= opj_optind) {
      return -1;
    }
    goto LAB_0010f74c;
  }
  if (totlen < 1) goto LAB_0010f86a;
  lVar2 = 0;
  while (iVar5 = strcmp(*(char **)((long)&longopts->name + lVar2),__s), iVar5 != 0) {
    lVar2 = lVar2 + 0x20;
    if (totlen <= (int)lVar2) {
LAB_0010f86a:
      opj_getopt_long_cold_2();
      return 0x3f;
    }
  }
  iVar5 = *(int *)((long)&longopts->has_arg + lVar2);
  pcVar7 = argv[(long)iVar6 + 1];
  if (iVar5 == 0) {
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '-')) goto LAB_0010f974;
    fprintf(_stderr,"%s: option does not require an argument. Ignoring %s\n",__s);
    iVar6 = opj_optind;
  }
  else {
    opj_optarg = pcVar7;
    if (pcVar7 == (char *)0x0) {
      if ((iVar5 == 1) && (opj_opterr != 0)) {
        pcVar7 = "%s: option requires an argument \n";
        goto LAB_0010fa0f;
      }
    }
    else if ((*pcVar7 == '-') && (opj_opterr != 0)) {
      pcVar7 = "%s: option requires an argument\n";
LAB_0010fa0f:
      fprintf(_stderr,pcVar7,__s);
      return 0x3f;
    }
  }
  iVar6 = iVar6 + 1;
LAB_0010f974:
  opj_optind = iVar6 + 1;
  piVar1 = *(int **)((long)&longopts->flag + lVar2);
  iVar6 = *(int *)((long)&longopts->val + lVar2);
  if (piVar1 == (int *)0x0) {
    return iVar6;
  }
  *piVar1 = iVar6;
  return 0;
}

Assistant:

int opj_getopt_long(int argc, char * const argv[], const char *optstring,
const opj_option_t *longopts, int totlen) {
	static int lastidx,lastofs;
	const char *tmp;
	int i,len;
	char param = 1;

again:
	if (opj_optind >= argc || !argv[opj_optind] || *argv[opj_optind]!='-')
		return -1;

	if (argv[opj_optind][0]=='-' && argv[opj_optind][1]==0) {
		if(opj_optind >= (argc - 1)){ /* no more input parameters */
			param = 0;
		}
		else{ /* more input parameters */
			if(argv[opj_optind + 1][0] == '-'){
				param = 0; /* Missing parameter after '-' */
			}
			else{
				param = 2;
			}
		}
	}

	if (param == 0) {
		++opj_optind;
		return (BADCH);
	}

	if (argv[opj_optind][0]=='-') {	/* long option */
		char* arg=argv[opj_optind]+1;
		const opj_option_t* o;
		o=longopts;
		len=sizeof(longopts[0]);

		if (param > 1){
			arg = argv[opj_optind+1];
			opj_optind++;
		}
		else
			arg = argv[opj_optind]+1;

		if(strlen(arg)>1){
			for (i=0;i<totlen;i=i+len,o++) {
				if (!strcmp(o->name,arg)) {	/* match */
					if (o->has_arg == 0) {
						if ((argv[opj_optind+1])&&(!(argv[opj_optind+1][0]=='-'))){
							fprintf(stderr,"%s: option does not require an argument. Ignoring %s\n",arg,argv[opj_optind+1]);
							++opj_optind;
						}
					}else{ 
						opj_optarg=argv[opj_optind+1];
						if(opj_optarg){
							if (opj_optarg[0] == '-'){ /* Has read next input parameter: No arg for current parameter */								
								if (opj_opterr) {
									fprintf(stderr,"%s: option requires an argument\n",arg);
									return (BADCH);
								}
							}
						}
						if (!opj_optarg && o->has_arg==1) {	/* no argument there */
							if (opj_opterr) {
								fprintf(stderr,"%s: option requires an argument \n",arg);
								return (BADCH);
							}
						}
						++opj_optind;
					}
					++opj_optind;
					if (o->flag)
						*(o->flag)=o->val;
					else
						return o->val;
					return 0;
				}
			}/*(end for)String not found in the list*/
			fprintf(stderr,"Invalid option %s\n",arg);
			++opj_optind;
			return (BADCH);
		}else{ /*Single character input parameter*/
			if (*optstring==':') return ':';
			if (lastidx!=opj_optind) {
				lastidx=opj_optind; lastofs=0;
			}
			opj_optopt=argv[opj_optind][lastofs+1];
			if ((tmp=strchr(optstring,opj_optopt))) {/*Found input parameter in list*/
				if (*tmp==0) {	/* apparently, we looked for \0, i.e. end of argument */
					++opj_optind;
					goto again;
				}
				if (tmp[1]==':') {	/* argument expected */
					if (tmp[2]==':' || argv[opj_optind][lastofs+2]) {	/* "-foo", return "oo" as opj_optarg */
						if (!*(opj_optarg=argv[opj_optind]+lastofs+2)) opj_optarg=0;
						goto found;
					}
					opj_optarg=argv[opj_optind+1];
					if(opj_optarg){
						if (opj_optarg[0] == '-'){ /* Has read next input parameter: No arg for current parameter */
							if (opj_opterr) {
								fprintf(stderr,"%s: option requires an argument\n",arg);
								return (BADCH);
							}
						}
					}
					if (!opj_optarg) {	/* missing argument */
						if (opj_opterr) {
							fprintf(stderr,"%s: option requires an argument\n",arg);
							return (BADCH);
						}
					}
					++opj_optind;
				}else {/*Argument not expected*/
					++lastofs;
					return opj_optopt;
				}
found:
				++opj_optind;
				return opj_optopt;
			}	else {	/* not found */
				fprintf(stderr,"Invalid option %s\n",arg);
				++opj_optind;
				return (BADCH);
			}/*end of not found*/
		
		}/* end of single character*/
	}/*end '-'*/
	fprintf(stderr,"Invalid option\n");
	++opj_optind;
	return (BADCH);;
}